

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O2

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  void *pvVar12;
  void *pvVar13;
  Mat rgb_channels;
  Mat local_78;
  
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    else if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar1 = (float *)__return_storage_ptr__->data;
      if (pfVar1 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar2 = 0;
      iVar9 = 0;
      if (0 < h) {
        iVar9 = h;
      }
      iVar3 = 1;
      if (stride - w == 0) {
        iVar9 = 1;
        iVar3 = h;
      }
      pbVar11 = pixels;
      for (; iVar4 = iVar3 * w, iVar2 != iVar9; iVar2 = iVar2 + 1) {
        for (; 0 < iVar4; iVar4 = iVar4 + -1) {
          *pfVar1 = (float)*pbVar11;
          pbVar11 = pbVar11 + 1;
          pfVar1 = pfVar1 + 1;
        }
        pbVar11 = pbVar11 + (stride - w);
      }
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    if (__return_storage_ptr__->data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar9 = 0;
    if (0 < h) {
      iVar9 = h;
    }
    iVar3 = stride + w * -4;
    iVar2 = 1;
    if (iVar3 == 0) {
      iVar2 = h;
    }
    channel(&rgb_channels,__return_storage_ptr__,0);
    pfVar1 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar7 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    pfVar6 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,3);
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar9 = 1;
    }
    for (iVar4 = 0; iVar10 = iVar2 * w, iVar4 != iVar9; iVar4 = iVar4 + 1) {
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        *pfVar1 = (float)*pixels;
        *pfVar7 = (float)pixels[1];
        *pfVar6 = (float)pixels[2];
        *(float *)rgb_channels.data = (float)pixels[3];
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar7 = pfVar7 + 1;
        pfVar6 = pfVar6 + 1;
        rgb_channels.data = (void *)((long)rgb_channels.data + 4);
      }
      pixels = pixels + iVar3;
    }
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x10002:
switchD_0013f4ac_caseD_20001:
    from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  case 0x10003:
switchD_0013f4ac_caseD_20003:
    from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    return __return_storage_ptr__;
  case 0x10004:
switchD_0013f4ac_caseD_20005:
    create(__return_storage_ptr__,w,h,3,4,allocator);
    if (__return_storage_ptr__->data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar9 = 0;
    if (0 < h) {
      iVar9 = h;
    }
    iVar3 = stride + w * -4;
    iVar2 = 1;
    if (iVar3 == 0) {
      iVar2 = h;
    }
    channel(&rgb_channels,__return_storage_ptr__,0);
    pfVar1 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar7 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar9 = 1;
    }
    for (iVar4 = 0; iVar10 = iVar2 * w, iVar4 != iVar9; iVar4 = iVar4 + 1) {
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        *pfVar1 = (float)*pixels;
        *pfVar7 = (float)pixels[1];
        *(float *)rgb_channels.data = (float)pixels[2];
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar7 = pfVar7 + 1;
        rgb_channels.data = (void *)((long)rgb_channels.data + 4);
      }
      pixels = pixels + iVar3;
    }
    return __return_storage_ptr__;
  case 0x10005:
switchD_0013f4ac_caseD_20004:
    create(__return_storage_ptr__,w,h,3,4,allocator);
    if (__return_storage_ptr__->data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar9 = 0;
    if (0 < h) {
      iVar9 = h;
    }
    iVar3 = stride + w * -4;
    iVar2 = 1;
    if (iVar3 == 0) {
      iVar2 = h;
    }
    channel(&rgb_channels,__return_storage_ptr__,0);
    pfVar1 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,1);
    pfVar7 = (float *)rgb_channels.data;
    ~Mat(&rgb_channels);
    channel(&rgb_channels,__return_storage_ptr__,2);
    ~Mat(&rgb_channels);
    if (stride == w * 4) {
      iVar9 = 1;
    }
    for (iVar4 = 0; iVar10 = iVar2 * w, iVar4 != iVar9; iVar4 = iVar4 + 1) {
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        *pfVar1 = (float)pixels[2];
        *pfVar7 = (float)pixels[1];
        *(float *)rgb_channels.data = (float)*pixels;
        pixels = pixels + 4;
        pfVar1 = pfVar1 + 1;
        pfVar7 = pfVar7 + 1;
        rgb_channels.data = (void *)((long)rgb_channels.data + 4);
      }
      pixels = pixels + iVar3;
    }
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x20001:
    goto switchD_0013f4ac_caseD_20001;
  case 0x20002:
switchD_0013f27a_default:
    fprintf(_stderr,"unimplemented convert type %d",(ulong)(uint)type);
    fputc(10,_stderr);
    return __return_storage_ptr__;
  case 0x20003:
    goto switchD_0013f4ac_caseD_20003;
  case 0x20004:
    goto switchD_0013f4ac_caseD_20004;
  case 0x20005:
    goto switchD_0013f4ac_caseD_20005;
  }
  switch(type) {
  case 0x30001:
    iVar9 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if ((pfVar1 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar4 = w * -3 + stride;
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      if (iVar4 == 0) {
        iVar2 = iVar9;
        iVar9 = h;
      }
      for (; iVar10 = iVar9 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          *pfVar1 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                           >> 8);
          pixels = pixels + 3;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar4;
      }
    }
    break;
  case 0x30002:
    iVar9 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if ((pfVar1 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar4 = w * -3 + stride;
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      if (iVar4 == 0) {
        iVar2 = iVar9;
        iVar9 = h;
      }
      for (; iVar10 = iVar9 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          *pfVar1 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                           >> 8);
          pixels = pixels + 3;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar4;
      }
    }
    break;
  case 0x30003:
    goto switchD_0013f27a_default;
  case 0x30004:
    iVar9 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if ((pfVar1 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      iVar4 = stride + w * -4;
      if (iVar4 == 0) {
        iVar2 = iVar9;
        iVar9 = h;
      }
      for (; iVar10 = iVar9 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          *pfVar1 = (float)((uint)pixels[2] * 0x1d + (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d
                           >> 8);
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar4;
      }
    }
    break;
  case 0x30005:
    iVar9 = 1;
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar1 = (float *)__return_storage_ptr__->data;
    if ((pfVar1 != (float *)0x0) &&
       ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
      iVar3 = 0;
      iVar2 = 0;
      if (0 < h) {
        iVar2 = h;
      }
      iVar4 = stride + w * -4;
      if (iVar4 == 0) {
        iVar2 = iVar9;
        iVar9 = h;
      }
      for (; iVar10 = iVar9 * w, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          *pfVar1 = (float)((uint)*pixels * 0x1d + (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d
                           >> 8);
          pixels = pixels + 4;
          pfVar1 = pfVar1 + 1;
        }
        pixels = pixels + iVar4;
      }
    }
    break;
  default:
    switch(type) {
    case 0x40001:
switchD_0013f27a_caseD_50002:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      if (__return_storage_ptr__->data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      channel_range(&rgb_channels,__return_storage_ptr__,0,3);
      from_rgb(pixels,w,h,stride,&rgb_channels,allocator);
      channel(&local_78,__return_storage_ptr__,3);
      break;
    case 0x40002:
switchD_0013f27a_caseD_50001:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      if (__return_storage_ptr__->data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      channel_range(&rgb_channels,__return_storage_ptr__,0,3);
      from_rgb2bgr(pixels,w,h,stride,&rgb_channels,allocator);
      channel(&local_78,__return_storage_ptr__,3);
      break;
    case 0x40003:
switchD_0013f27a_caseD_50003:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      if (__return_storage_ptr__->data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      channel_range(&rgb_channels,__return_storage_ptr__,0,3);
      from_gray2rgb(pixels,w,h,stride,&rgb_channels,allocator);
      channel(&local_78,__return_storage_ptr__,3);
      break;
    case 0x40004:
      goto switchD_0013f27a_default;
    case 0x40005:
switchD_0013f27a_caseD_50004:
      create(__return_storage_ptr__,w,h,4,4,allocator);
      if (__return_storage_ptr__->data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar9 = 0;
      if (0 < h) {
        iVar9 = h;
      }
      iVar3 = stride + w * -4;
      iVar2 = 1;
      if (iVar3 == 0) {
        iVar2 = h;
      }
      channel(&rgb_channels,__return_storage_ptr__,0);
      pvVar13 = rgb_channels.data;
      ~Mat(&rgb_channels);
      channel(&rgb_channels,__return_storage_ptr__,1);
      pvVar12 = rgb_channels.data;
      ~Mat(&rgb_channels);
      channel(&rgb_channels,__return_storage_ptr__,2);
      pvVar8 = rgb_channels.data;
      ~Mat(&rgb_channels);
      channel(&rgb_channels,__return_storage_ptr__,3);
      ~Mat(&rgb_channels);
      if (stride == w * 4) {
        iVar9 = 1;
      }
      for (iVar4 = 0; iVar4 != iVar9; iVar4 = iVar4 + 1) {
        lVar5 = 0;
        for (iVar10 = iVar2 * w; 0 < iVar10; iVar10 = iVar10 + -1) {
          *(float *)((long)pvVar13 + lVar5) = (float)pixels[lVar5 + 2];
          *(float *)((long)pvVar12 + lVar5) = (float)pixels[lVar5 + 1];
          *(float *)((long)pvVar8 + lVar5) = (float)pixels[lVar5];
          *(float *)((long)rgb_channels.data + lVar5) = (float)pixels[lVar5 + 3];
          lVar5 = lVar5 + 4;
        }
        pixels = pixels + lVar5 + iVar3;
        pvVar13 = (void *)((long)pvVar13 + lVar5);
        pvVar12 = (void *)((long)pvVar12 + lVar5);
        pvVar8 = (void *)((long)pvVar8 + lVar5);
        rgb_channels.data = (void *)((long)rgb_channels.data + lVar5);
      }
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x50001:
        goto switchD_0013f27a_caseD_50001;
      case 0x50002:
        goto switchD_0013f27a_caseD_50002;
      case 0x50003:
        goto switchD_0013f27a_caseD_50003;
      case 0x50004:
        goto switchD_0013f27a_caseD_50004;
      default:
        goto switchD_0013f27a_default;
      }
    }
    fill(&local_78,255.0);
    ~Mat(&local_78);
    ~Mat(&rgb_channels);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}